

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku_chain.cpp
# Opt level: O3

int __thiscall
SudokuChain::getFieldIndex
          (SudokuChain *this,int x,int y,shared_ptr<SudokuChain::SudokuSpecification> *specification
          )

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  shared_ptr<SudokuChain::SudokuSpecification> local_18;
  
  peVar1 = (specification->
           super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_18.super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->previous).
       super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_18.super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    iVar2 = x + peVar1->firstOwnIndex + y * peVar1->squared_size;
  }
  else {
    if (x < peVar1->xa) {
      iVar4 = peVar1->ya;
    }
    else {
      iVar4 = peVar1->ya;
      if ((iVar4 <= y && x < peVar1->xb) && (y < peVar1->yb)) {
        iVar2 = peVar1->offset_from_previous_x;
        iVar4 = peVar1->offset_from_previous_y;
        local_18.super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (peVar1->previous).
             super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_18.
            super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_18.
             super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_18.
                  super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_18.
             super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_18.
                  super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        iVar2 = getFieldIndex(this,x + iVar2,y + iVar4,&local_18);
        if (local_18.
            super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return iVar2;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_18.
                   super___shared_ptr<SudokuChain::SudokuSpecification,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        return iVar2;
      }
    }
    iVar2 = peVar1->firstOwnIndex;
    if (0 < y) {
      iVar3 = 0;
      do {
        if (iVar3 < iVar4) {
          iVar5 = peVar1->squared_size;
        }
        else {
          iVar5 = peVar1->squared_size;
          if (iVar3 < peVar1->yb) {
            iVar5 = (iVar5 + peVar1->xa) - peVar1->xb;
          }
        }
        iVar2 = iVar2 + iVar5;
        iVar3 = iVar3 + 1;
      } while (y != iVar3);
    }
    if ((iVar4 <= y) && (y < peVar1->yb)) {
      iVar4 = 0;
      if (peVar1->xb <= x) {
        iVar4 = peVar1->xb;
      }
      x = x - iVar4;
    }
    iVar2 = x + iVar2;
  }
  return iVar2;
}

Assistant:

int SudokuChain::getFieldIndex(int x, int y, std::shared_ptr<SudokuSpecification> specification)
{
  bool debug = false;

  if(specification->previous == nullptr)
  {
    if(debug)
      std::cout<<"    (no previous)"<<std::endl;
    return specification->firstOwnIndex + y*specification->squared_size + x;
  }

  // compute coordinates of with previous overlapping area in current sudoku
  int &xa = specification->xa;
  int &ya = specification->ya;
  int &xb = specification->xb;
  int &yb = specification->yb;

  // check if position is inside with previous overlapping area in current sudoku
  if(x >= xa && x < xb && y >= ya && y < yb)
  {
    if(debug)
      std::cout<<"    (ask previous at (x,y)=("<<x+specification->offset_from_previous_x<<", "<<y+specification->offset_from_previous_y<<")"<<std::endl;
    return getFieldIndex(x+specification->offset_from_previous_x, y+specification->offset_from_previous_y, specification->previous);
  }
  else
  {
    int index = specification->firstOwnIndex;

    // number of elements in rows before current row (y)
    for(int y_index = 0; y_index < y; y_index++)
    {
      if(ya <= y_index && y_index < yb)
      {
        index += specification->squared_size - (xb-xa);
      }
      else
      {
        index += specification->squared_size;
      }
    }
    if(ya <= y && y < yb)
    {
      if(xb <= x)
      {
        index += x-xb;
      }
      else
      {
        index += x;
      }
    }
    else
    {
      index += x;
    }
    return index;
  }
}